

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeutils.cpp
# Opt level: O2

frame * read_frame_from_pipe(frame *__return_storage_ptr__,pipestruct p)

{
  string f_str;
  string local_50;
  string local_30;
  
  read_pipe_abi_cxx11_(&local_30,p);
  std::__cxx11::string::string((string *)&local_50,(string *)&local_30);
  frame_from_string(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

frame read_frame_from_pipe(pipestruct p) {
	string f_str = read_pipe(p);
	return frame_from_string(f_str);
}